

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

command * __thiscall
libchars::command_set::add
          (command_set *this,string *cmd_str,char *name,id_t ID,filter_t mask_,bool hidden_)

{
  _Head_base<0UL,_libchars::token_*,_false> _Var1;
  _Head_base<0UL,_libchars::token_*,_false> _Var2;
  command *this_00;
  debug *this_01;
  undefined7 in_register_00000089;
  undefined4 uVar3;
  double __x;
  undefined1 local_70 [8];
  string cmd_str_sanitized;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> local_48;
  unique_ptr<libchars::token,_std::default_delete<libchars::token>_> Tadd;
  
  if (name == (char *)0x0 && ID == -1) {
    this_00 = (command *)0x0;
  }
  else {
    _Var1._M_head_impl = lexer(cmd_str);
    uVar3 = (undefined4)CONCAT71(in_register_00000089,hidden_);
    local_48._M_t.super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>._M_t
    .super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>.
    super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl =
         (__uniq_ptr_data<libchars::token,_std::default_delete<libchars::token>,_true,_true>)
         (__uniq_ptr_data<libchars::token,_std::default_delete<libchars::token>,_true,_true>)
         _Var1._M_head_impl;
    if ((_Head_base<0UL,_libchars::token_*,_false>)_Var1._M_head_impl ==
        (_Head_base<0UL,_libchars::token_*,_false>)0x0) {
      this_00 = (command *)0x0;
    }
    else {
      this_00 = (command *)0x0;
      for (_Var2._M_head_impl = _Var1._M_head_impl; cmd_str_sanitized.field_2._8_8_ = mask_,
          Tadd._M_t.super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>.
          _M_t.super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>.
          super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl._4_4_ = uVar3,
          (_Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>)
          _Var2._M_head_impl != (token *)0x0;
          _Var2._M_head_impl = *(token **)((long)_Var2._M_head_impl + 0x88)) {
        if (((*(byte *)((long)_Var2._M_head_impl + 0x6d) & 4) != 0) ||
           (*(size_type *)((long)_Var2._M_head_impl + 8) == 0)) goto LAB_0010f833;
      }
      std::__cxx11::string::string((string *)local_70,(string *)_Var1._M_head_impl);
      while (_Var1._M_head_impl = (_Var1._M_head_impl)->next, _Var1._M_head_impl != (token *)0x0) {
        std::__cxx11::string::push_back((char)(string *)local_70);
        std::__cxx11::string::append((string *)local_70);
      }
      this->dirty = true;
      this_00 = (command *)operator_new(0x98);
      command::command(this_00,(string *)local_70,name,cmd_str_sanitized.field_2._8_8_,ID,
                       Tadd._M_t.
                       super___uniq_ptr_impl<libchars::token,_std::default_delete<libchars::token>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libchars::token_*,_std::default_delete<libchars::token>_>
                       .super__Head_base<0UL,_libchars::token_*,_false>._M_head_impl._4_1_);
      this_01 = debug::initialize(0);
      debug::log(this_01,__x);
      if (this->C_list != (command *)0x0) {
        this_00->next = this->C_list;
      }
      this->C_list = this_00;
      std::__cxx11::string::~string((string *)local_70);
    }
LAB_0010f833:
    std::unique_ptr<libchars::token,_std::default_delete<libchars::token>_>::~unique_ptr(&local_48);
  }
  return this_00;
}

Assistant:

command* command_set::add(const std::string &cmd_str, const char *name, token::id_t ID, command::filter_t mask_, bool hidden_)
    {
        if (name != NULL || ID != token::ID_NOT_SET) {
            // break command string into tokens
            std::unique_ptr<token> Tadd(libchars::lexer(cmd_str));
            if (Tadd.get() == NULL)
                return NULL;
            // make sure none of the tokens are quoted strings nor empty strings
            token *T = Tadd.get();
            while (T != NULL) {
                if (T->status & token::IS_QUOTED)
                    return NULL;
                if (T->value.empty())
                    return NULL;
                T = T->next;
            }
            // build sanitized version of command string
            T = Tadd.get();
            std::string cmd_str_sanitized(T->value);
            T = T->next;
            while (T != NULL) {
                cmd_str_sanitized += ' ';
                cmd_str_sanitized.append(T->value);
                T = T->next;
            }
            // add command to internal list
            dirty = true;
            command *c_new = new command(cmd_str_sanitized, name, mask_, ID, hidden_);
            LC_LOG_VERBOSE("set[%p] command[%s] = %p",this,cmd_str_sanitized.c_str(),c_new);
            if (C_list != NULL)
                c_new->next = C_list;
            C_list = c_new;
            return c_new;
        }
        return NULL;
    }